

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-recv-in-a-row.c
# Opt level: O2

int run_test_udp_recv_in_a_row(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  uv_buf_t uVar7;
  int64_t eval_b;
  int64_t eval_a;
  
  uVar3 = uv_default_loop();
  iVar1 = uv_check_init(uVar3,&check_handle);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_check_start(&check_handle,check_cb);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        uVar3 = uv_default_loop();
        iVar1 = uv_udp_init(uVar3,&server);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_udp_bind(&server,&addr,0);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              uVar3 = uv_default_loop();
              iVar1 = uv_udp_init(uVar3,&client);
              eval_a = (int64_t)iVar1;
              eval_b = 0;
              if (eval_a == 0) {
                buf = (uv_buf_t)uv_buf_init(send_data,10);
                iVar1 = 4;
                do {
                  bVar6 = iVar1 == 0;
                  iVar1 = iVar1 + -1;
                  if (bVar6) {
                    uVar7 = (uv_buf_t)uv_buf_init(0,0);
                    buf = uVar7;
                    iVar1 = uv_udp_try_send(&client,&buf,1,&addr);
                    eval_a = (int64_t)iVar1;
                    eval_b = 0;
                    if (eval_a == 0) {
                      uVar3 = uv_default_loop();
                      iVar1 = uv_run(uVar3,0);
                      eval_a = (int64_t)iVar1;
                      eval_b = 0;
                      if (eval_a == 0) {
                        if (check_cb_called == '\0') {
                          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
                                  ,0x75,"check_cb_called");
                          abort();
                        }
                        uVar3 = uv_default_loop();
                        uv_walk(uVar3,close_walk_cb,0);
                        uv_run(uVar3,0);
                        eval_a = 0;
                        uVar3 = uv_default_loop();
                        iVar1 = uv_loop_close(uVar3);
                        eval_b = (int64_t)iVar1;
                        if (eval_b == 0) {
                          uv_library_shutdown();
                          return 0;
                        }
                        pcVar5 = "uv_loop_close(uv_default_loop())";
                        pcVar4 = "0";
                        uVar3 = 0x77;
                      }
                      else {
                        pcVar5 = "0";
                        pcVar4 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                        uVar3 = 0x73;
                      }
                    }
                    else {
                      pcVar5 = "0";
                      pcVar4 = "r";
                      uVar3 = 0x6d;
                    }
                    goto LAB_001b06b0;
                  }
                  iVar2 = uv_udp_try_send(&client,&buf,1,&addr);
                  eval_a = 10;
                  eval_b = (int64_t)iVar2;
                } while (eval_b == 10);
                pcVar5 = "r";
                pcVar4 = "sizeof(send_data)";
                uVar3 = 100;
              }
              else {
                pcVar5 = "0";
                pcVar4 = "uv_udp_init(uv_default_loop(), &client)";
                uVar3 = 0x5b;
              }
            }
            else {
              pcVar5 = "0";
              pcVar4 = "uv_udp_recv_start(&server, alloc_cb, sv_recv_cb)";
              uVar3 = 0x59;
            }
          }
          else {
            pcVar5 = "0";
            pcVar4 = "uv_udp_bind(&server, (const struct sockaddr*) &addr, 0)";
            uVar3 = 0x58;
          }
        }
        else {
          pcVar5 = "0";
          pcVar4 = "uv_udp_init(uv_default_loop(), &server)";
          uVar3 = 0x57;
        }
      }
      else {
        pcVar5 = "0";
        pcVar4 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
        uVar3 = 0x55;
      }
    }
    else {
      pcVar5 = "0";
      pcVar4 = "uv_check_start(&check_handle, check_cb)";
      uVar3 = 0x53;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "uv_check_init(uv_default_loop(), &check_handle)";
    uVar3 = 0x52;
  }
LAB_001b06b0:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(udp_recv_in_a_row) {
  int i, r;
  
  ASSERT_OK(uv_check_init(uv_default_loop(), &check_handle));
  ASSERT_OK(uv_check_start(&check_handle, check_cb));

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT_OK(uv_udp_init(uv_default_loop(), &server));
  ASSERT_OK(uv_udp_bind(&server, (const struct sockaddr*) &addr, 0));
  ASSERT_OK(uv_udp_recv_start(&server, alloc_cb, sv_recv_cb));

  ASSERT_OK(uv_udp_init(uv_default_loop(), &client));

  /* send N-1 udp packets */
  buf = uv_buf_init(send_data, sizeof(send_data));
  for (i = 0; i < N - 1; i ++) {
    r = uv_udp_try_send(&client,
                        &buf,
                        1,
                        (const struct sockaddr*) &addr);
    ASSERT_EQ(sizeof(send_data), r);
  }

  /* send an empty udp packet */
  buf = uv_buf_init(NULL, 0);
  r = uv_udp_try_send(&client,
                      &buf,
                      1,
                      (const struct sockaddr*) &addr);
  ASSERT_OK(r);

  /* check_cb() asserts that the N packets can be received
   * before it gets called. 
   */

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(check_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}